

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O2

ostream * covenant::operator<<
                    (ostream *o,
                    set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *s)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  std::operator<<(o,"{");
  for (p_Var2 = (s->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(s->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
    std::operator<<(poVar1,";");
  }
  std::operator<<(o,"}");
  return o;
}

Assistant:

inline ostream& operator<<(ostream& o, const set<T> &s) {
    o << "{";
    for(typename set<T>::iterator it= s.begin(), et= s.end(); it!=et; ++it)
      o << *it << ";" ;
    o << "}";
    return o;
  }